

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O0

void Abc_SclInsertBarBufs(Abc_Ntk_t *pNtk,Vec_Int_t *vBufs)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vBufs_local;
  Abc_Ntk_t *pNtk_local;
  
  for (local_24 = 0; iVar1 = Vec_IntSize(vBufs), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vBufs,local_24);
    pAVar2 = Abc_NtkObj(pNtk,iVar1);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      (pAVar2->field_5).pData = (void *)0x0;
    }
  }
  return;
}

Assistant:

void Abc_SclInsertBarBufs( Abc_Ntk_t * pNtk, Vec_Int_t * vBufs )
{
    Abc_Obj_t * pObj; int i;
    Abc_NtkForEachObjVec( vBufs, pNtk, pObj, i )
        pObj->pData = NULL;
}